

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servls.cpp
# Opt level: O0

int32_t __thiscall icu_63::ServiceEnumeration::count(ServiceEnumeration *this,UErrorCode *status)

{
  UBool UVar1;
  int32_t local_24;
  UErrorCode *status_local;
  ServiceEnumeration *this_local;
  
  UVar1 = upToDate(this,status);
  if (UVar1 == '\0') {
    local_24 = 0;
  }
  else {
    local_24 = UVector::size(&this->_ids);
  }
  return local_24;
}

Assistant:

virtual int32_t count(UErrorCode& status) const {
        return upToDate(status) ? _ids.size() : 0;
    }